

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
_extractValue(ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,string *val)

{
  ulong uVar1;
  char *__rhs;
  string *in_RSI;
  string *in_RDI;
  CmdLineParseException *unaff_retaddr;
  ArgParseException *e;
  string *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined1 local_f8 [224];
  StringLike local_18;
  string *text;
  
  local_18._vptr_StringLike = (_func_int **)0x0;
  text = in_RDI;
  StringLike::StringLike(&local_18);
  ExtractValue<std::__cxx11::string>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(StringLike *)0x196a9e);
  StringLike::~StringLike(&local_18);
  if ((in_RDI[8]._M_string_length != 0) &&
     (uVar1 = (**(code **)(*(long *)in_RDI[8]._M_string_length + 0x10))
                        ((long *)in_RDI[8]._M_string_length,&in_RDI[5]._M_string_length),
     (uVar1 & 1) == 0)) {
    uVar2 = 1;
    __rhs = (char *)__cxa_allocate_exception(0x68);
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffeb8,__rhs);
    (*(code *)**(undefined8 **)in_RDI[8]._M_string_length)(local_f8);
    std::operator+(in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffee0));
    (**(code **)(*(long *)in_RDI + 0x38))(&stack0xfffffffffffffee8);
    CmdLineParseException::CmdLineParseException(unaff_retaddr,text,in_RSI);
    __cxa_throw(__rhs,&CmdLineParseException::typeinfo,CmdLineParseException::~CmdLineParseException
               );
  }
  return;
}

Assistant:

void ValueArg<T>::_extractValue( const std::string& val ) 
{
    try {
	ExtractValue(_value, val, typename ArgTraits<T>::ValueCategory());
    } catch( ArgParseException &e) {
	throw ArgParseException(e.error(), toString());
    }
    
    if ( _constraint != NULL )
	if ( ! _constraint->check( _value ) )
	    throw( CmdLineParseException( "Value '" + val + 
					  + "' does not meet constraint: " 
					  + _constraint->description(),
					  toString() ) );
}